

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  char *__first;
  char *__n;
  buffer<char> *in_RDX;
  buffer<char> *in_RSI;
  char *in_RDI;
  size_t free_cap;
  type count;
  size_t in_stack_ffffffffffffffb8;
  buffer<char> *in_stack_ffffffffffffffc0;
  buffer<char> *local_10;
  
  local_10 = in_RSI;
  do {
    __first = (char *)to_unsigned<long>((long)in_RDX - (long)local_10);
    try_reserve(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __n = (char *)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10));
    if (__n < __first) {
      __first = __n;
    }
    in_stack_ffffffffffffffc0 = local_10;
    make_checked<char>((char *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10)),(size_t)__first);
    std::uninitialized_copy_n<char_const*,unsigned_long,char*>(__first,(unsigned_long)__n,in_RDI);
    *(char **)(in_RDI + 0x10) = __first + *(long *)(in_RDI + 0x10);
    local_10 = (buffer<char> *)(__first + (long)local_10);
  } while (local_10 != in_RDX);
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  do {
    auto count = to_unsigned(end - begin);
    try_reserve(size_ + count);
    auto free_cap = capacity_ - size_;
    if (free_cap < count) count = free_cap;
    std::uninitialized_copy_n(begin, count, make_checked(ptr_ + size_, count));
    size_ += count;
    begin += count;
  } while (begin != end);
}